

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O2

void rgb_565_to_abgr_8888
               (void *src,int src_pitch,void *dst,int dst_pitch,int sx,int sy,int dx,int dy,
               int width,int height)

{
  uint *puVar1;
  ushort uVar2;
  ushort *puVar3;
  int iVar4;
  uint *puVar5;
  long lVar6;
  
  lVar6 = (long)width;
  puVar3 = (ushort *)((long)src + (long)sx * 2 + (long)(sy * src_pitch));
  iVar4 = 0;
  if (height < 1) {
    height = 0;
  }
  puVar5 = (uint *)((long)dst + (long)dx * 4 + (long)(dy * dst_pitch));
  for (; iVar4 != height; iVar4 = iVar4 + 1) {
    puVar1 = puVar5 + lVar6;
    for (; puVar5 < puVar1; puVar5 = puVar5 + 1) {
      uVar2 = *puVar3;
      *puVar5 = *(int *)((long)_al_rgb_scale_6 + (ulong)(uVar2 >> 3 & 0xfc)) << 8 |
                _al_rgb_scale_5[uVar2 & 0x1f] << 0x10 | _al_rgb_scale_5[uVar2 >> 0xb] | 0xff000000;
      puVar3 = puVar3 + 1;
    }
    puVar3 = puVar3 + (src_pitch / 2 - lVar6);
    puVar5 = puVar5 + (dst_pitch / 4 - lVar6);
  }
  return;
}

Assistant:

static void rgb_565_to_abgr_8888(const void *src, int src_pitch,
   void *dst, int dst_pitch,
   int sx, int sy, int dx, int dy, int width, int height)
{
   int y;
   const uint16_t *src_ptr = (const uint16_t *)((const char *)src + sy * src_pitch);
   uint32_t *dst_ptr = (void *)((char *)dst + dy * dst_pitch);
   int src_gap = src_pitch / 2 - width;
   int dst_gap = dst_pitch / 4 - width;
   src_ptr += sx;
   dst_ptr += dx;
   for (y = 0; y < height; y++) {
      uint32_t *dst_end = dst_ptr + width;
      while (dst_ptr < dst_end) {
         *dst_ptr = ALLEGRO_CONVERT_RGB_565_TO_ABGR_8888(*src_ptr);
         dst_ptr++;
         src_ptr++;
      }
      src_ptr += src_gap;
      dst_ptr += dst_gap;
   }
}